

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepScanLineOutputFile::initialize(DeepScanLineOutputFile *this,Header *header)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  long lVar4;
  void *pvVar5;
  pointer pcVar6;
  pointer ppLVar7;
  Format FVar8;
  int iVar9;
  Box2i *pBVar10;
  LineOrder *pLVar11;
  uint *puVar12;
  Compression *pCVar13;
  Compressor *pCVar14;
  LineBuffer *pLVar15;
  long *plVar16;
  pointer pcVar17;
  Data *pDVar18;
  char *pcVar19;
  Data *this_00;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&DEEPSCANLINE_abi_cxx11_);
  pBVar10 = Header::dataWindow(header);
  pLVar11 = Header::lineOrder(header);
  iVar9 = (pBVar10->min).y;
  iVar1 = (pBVar10->max).y;
  iVar23 = iVar1;
  if (*pLVar11 == INCREASING_Y) {
    iVar23 = iVar9;
  }
  pDVar18 = this->_data;
  pDVar18->currentScanLine = iVar23;
  pDVar18->missingScanLines = (iVar1 - iVar9) + 1;
  pLVar11 = Header::lineOrder(header);
  pDVar18 = this->_data;
  pDVar18->lineOrder = *pLVar11;
  iVar9 = (pBVar10->min).y;
  iVar1 = (pBVar10->max).x;
  iVar23 = (pBVar10->max).y;
  pDVar18->minX = (pBVar10->min).x;
  pDVar18->maxX = iVar1;
  pDVar18->minY = iVar9;
  pDVar18->maxY = iVar23;
  iVar23 = iVar23 - iVar9;
  uVar22 = 0xffffffffffffffff;
  if (-2 < iVar23) {
    uVar22 = (long)iVar23 * 4 + 4;
  }
  puVar12 = (uint *)operator_new__(uVar22);
  puVar2 = (pDVar18->lineSampleCount)._data;
  this_00 = pDVar18;
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
    this_00 = this->_data;
  }
  (pDVar18->lineSampleCount)._size = (long)iVar23 + 1;
  (pDVar18->lineSampleCount)._data = puVar12;
  pCVar13 = Header::compression(&this_00->header);
  pCVar14 = newCompressor(*pCVar13,0,&this->_data->header);
  FVar8 = defaultFormat(pCVar14);
  this->_data->format = FVar8;
  iVar9 = numLinesInBuffer(pCVar14);
  pDVar18 = this->_data;
  pDVar18->linesInBuffer = iVar9;
  if (pCVar14 != (Compressor *)0x0) {
    (*pCVar14->_vptr_Compressor[1])(pCVar14);
    pDVar18 = this->_data;
    iVar9 = pDVar18->linesInBuffer;
  }
  iVar9 = ((pDVar18->maxY - pDVar18->minY) + iVar9) / iVar9;
  Header::setChunkCount(&pDVar18->header,iVar9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_data->lineOffsets,(long)iVar9);
  pDVar18 = this->_data;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar18->bytesPerLine,(long)((pDVar18->maxY - pDVar18->minY) + 1));
  pDVar18 = this->_data;
  iVar9 = (pDVar18->maxY - pDVar18->minY) + 1;
  if (pDVar18->linesInBuffer <= iVar9) {
    iVar9 = pDVar18->linesInBuffer;
  }
  pDVar18->maxSampleCountTableSize = (long)(((pDVar18->maxX - pDVar18->minX) + 1) * iVar9) << 2;
  if ((pDVar18->lineBuffers).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar18->lineBuffers).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar22 = 0;
    do {
      pLVar15 = (LineBuffer *)operator_new(200);
      iVar9 = pDVar18->linesInBuffer;
      pcVar19 = (char *)(long)iVar9;
      *(undefined8 *)((long)&(pLVar15->exception).field_2 + 8) = 0;
      (pLVar15->_tempCountBuffer)._data = (uint *)0x0;
      *(undefined2 *)&pLVar15->_sem = 0;
      pLVar15->uncompressedData = (char *)0x0;
      pLVar15->buffer = (char *)0x0;
      pLVar15->packedDataSize = 0;
      pLVar15->unpackedDataSize = 0;
      pLVar15->minY = 0;
      pLVar15->maxY = 0;
      pLVar15->format = NATIVE;
      pLVar15->number = 0;
      pLVar15->hasException = false;
      *(undefined7 *)&pLVar15->field_0x39 = 0;
      (pLVar15->exception)._M_dataplus = (pointer)0x0;
      (pLVar15->exception)._M_string_length = 0;
      *(undefined1 **)&pLVar15->field_0x80 = &pLVar15->field_0x90;
      *(undefined8 *)(&pLVar15->field_0x80 + 8) = 0;
      pLVar15->field_0x90 = 0;
      IlmThread_3_2::Semaphore::Semaphore((Semaphore *)(pLVar15 + 1),1);
      uVar20 = (long)pcVar19 * 0x10 + 8;
      if (iVar9 < 0) {
        uVar20 = 0xffffffffffffffff;
      }
      plVar16 = (long *)operator_new__(uVar20);
      *plVar16 = (long)pcVar19;
      if (iVar9 != 0) {
        memset(plVar16 + 1,0,(long)pcVar19 * 0x10);
      }
      pcVar3 = pLVar15->buffer;
      if (pcVar3 != (char *)0x0) {
        lVar4 = *(long *)(pcVar3 + -8);
        if (lVar4 != 0) {
          lVar21 = lVar4 << 4;
          do {
            pvVar5 = *(void **)(pcVar3 + -8 + lVar21);
            if (pvVar5 != (void *)0x0) {
              operator_delete__(pvVar5);
            }
            lVar21 = lVar21 + -0x10;
          } while (lVar21 != 0);
        }
        operator_delete__(pcVar3 + -8,lVar4 << 4 | 8);
      }
      pLVar15->uncompressedData = pcVar19;
      pLVar15->buffer = (char *)(plVar16 + 1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22] = pLVar15;
      pDVar18 = this->_data;
      uVar20 = pDVar18->maxSampleCountTableSize;
      pLVar15 = (pDVar18->lineBuffers).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22];
      pcVar17 = (pointer)operator_new__(uVar20);
      pcVar6 = (pLVar15->exception)._M_dataplus._M_p;
      if (pcVar6 != (pointer)0x0) {
        operator_delete__(pcVar6);
        pDVar18 = this->_data;
      }
      *(ulong *)&pLVar15->hasException = uVar20;
      (pLVar15->exception)._M_dataplus._M_p = pcVar17;
      pCVar13 = Header::compression(&pDVar18->header);
      pCVar14 = newCompressor(*pCVar13,this->_data->maxSampleCountTableSize,&this->_data->header);
      pDVar18 = this->_data;
      ppLVar7 = (pDVar18->lineBuffers).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(Compressor **)((long)&(ppLVar7[uVar22]->exception).field_2 + 8) = pCVar14;
      uVar22 = uVar22 + 1;
    } while (uVar22 < (ulong)((long)(pDVar18->lineBuffers).
                                    super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar7 >> 3)
            );
  }
  return;
}

Assistant:

void
DeepScanLineOutputFile::initialize (const Header& header)
{
    _data->header = header;

    _data->header.setType (DEEPSCANLINE);

    const Box2i& dataWindow = header.dataWindow ();

    _data->currentScanLine = (header.lineOrder () == INCREASING_Y)
                                 ? dataWindow.min.y
                                 : dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder        = header.lineOrder ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

    Compressor* compressor =
        newCompressor (_data->header.compression (), 0, _data->header);
    _data->format        = defaultFormat (compressor);
    _data->linesInBuffer = numLinesInBuffer (compressor);
    if (compressor != 0) delete compressor;

    int lineOffsetSize = (_data->maxY - _data->minY + _data->linesInBuffer) /
                         _data->linesInBuffer;

    _data->header.setChunkCount (lineOffsetSize);

    _data->lineOffsets.resize (lineOffsetSize);

    _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

    _data->maxSampleCountTableSize =
        min (_data->linesInBuffer, _data->maxY - _data->minY + 1) *
        (_data->maxX - _data->minX + 1) * sizeof (unsigned int);

    for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (_data->linesInBuffer);
        _data->lineBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        _data->lineBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}